

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O1

void sprintf<int,int,char_const*>(stringstream *oss,string *fmt,int value,int args,char *args_1)

{
  ostream *this;
  ostream *poVar1;
  byte bVar2;
  int iVar3;
  pointer pcVar4;
  long lVar5;
  char *__nptr;
  bool bVar6;
  ostream oVar7;
  runtime_error *prVar8;
  int *piVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  char *pcVar13;
  ulong uVar14;
  bool bVar15;
  undefined1 auVar16 [12];
  string local_70;
  char *local_50;
  int local_48;
  int local_44;
  char *local_40;
  char *local_38;
  
  bVar15 = fmt->_M_string_length != 0;
  local_48 = value;
  local_44 = args;
  local_38 = args_1;
  if (bVar15) {
    this = (ostream *)(oss + 0x10);
    uVar14 = 0;
    do {
      pcVar4 = (fmt->_M_dataplus)._M_p;
      uVar11 = uVar14;
      if ((pcVar4[uVar14] == '%') && (uVar11 = uVar14 + 1, pcVar4[uVar14 + 1] != '%')) {
        uVar14 = std::__cxx11::string::find_first_of((char *)fmt,0x12ed72,uVar11);
        if (uVar14 <= uVar11) {
          bVar6 = false;
          uVar12 = uVar11;
          goto LAB_001194b5;
        }
        bVar6 = false;
        goto LAB_001193db;
      }
      local_70._M_dataplus._M_p._0_1_ = pcVar4[uVar11];
      std::__ostream_insert<char,std::char_traits<char>>(this,(char *)&local_70,1);
      uVar14 = uVar11 + 1;
      bVar15 = uVar14 < fmt->_M_string_length;
    } while (bVar15);
  }
  goto LAB_0011937a;
LAB_001193db:
  do {
    bVar2 = (fmt->_M_dataplus)._M_p[uVar11];
    uVar12 = uVar11;
    if (bVar2 < 0x2b) {
      if (bVar2 != 0x20) {
        if (bVar2 != 0x23) break;
        bVar6 = true;
      }
    }
    else if (bVar2 == 0x2b) {
      *(uint *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x28) =
           *(uint *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x28) | 0x800;
    }
    else if (bVar2 == 0x2d) {
      *(uint *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x28) =
           *(uint *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x28) & 0xffffff4f | 0x20;
    }
    else {
      if (bVar2 != 0x30) break;
      if (((byte)oss[*(long *)(*(long *)oss + -0x18) + 0x18] & 0x20) == 0) {
        poVar1 = this + *(long *)(*(long *)this + -0x18);
        if (oss[*(long *)(*(long *)this + -0x18) + 0xf1] == (stringstream)0x0) {
          oVar7 = (ostream)std::ios::widen((char)poVar1);
          poVar1[0xe0] = oVar7;
          poVar1[0xe1] = (ostream)0x1;
        }
        poVar1[0xe0] = (ostream)0x30;
      }
    }
    uVar11 = uVar11 + 1;
    uVar12 = uVar14;
  } while (uVar14 != uVar11);
LAB_001194b5:
  std::__cxx11::string::substr((ulong)&local_70,(ulong)fmt);
  pcVar13 = (char *)CONCAT71(local_70._M_dataplus._M_p._1_7_,(char)local_70._M_dataplus._M_p);
  piVar9 = __errno_location();
  iVar3 = *piVar9;
  *piVar9 = 0;
  lVar10 = strtol(pcVar13,&local_50,10);
  local_40 = local_50;
  if (local_50 == pcVar13) {
    std::__throw_invalid_argument("stoi");
LAB_00119722:
    std::__throw_out_of_range("stoi");
  }
  else {
    if ((lVar10 - 0x80000000U < 0xffffffff00000000) || (*piVar9 == 0x22)) goto LAB_00119722;
    if (*piVar9 == 0) {
      *piVar9 = iVar3;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_70._M_dataplus._M_p._1_7_,(char)local_70._M_dataplus._M_p) !=
        &local_70.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_70._M_dataplus._M_p._1_7_,(char)local_70._M_dataplus._M_p),
                      local_70.field_2._M_allocated_capacity + 1);
    }
    *(long *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x20) = (long)(int)lVar10;
    pcVar13 = local_40 + (uVar12 - (long)pcVar13);
    if (pcVar13[(long)(fmt->_M_dataplus)._M_p] != '.') {
LAB_00119665:
      if ((byte)(pcVar13[(long)(fmt->_M_dataplus)._M_p] | 0x20U) == 0x78) {
        lVar10 = *(long *)(oss + 0x10);
        lVar5 = *(long *)(lVar10 + -0x18);
        *(uint *)(oss + lVar5 + 0x28) = *(uint *)(oss + lVar5 + 0x28) & 0xffffffb5 | 8;
        if (bVar6) {
          *(uint *)(oss + *(long *)(lVar10 + -0x18) + 0x28) =
               *(uint *)(oss + *(long *)(lVar10 + -0x18) + 0x28) | 0x200;
        }
      }
      std::ostream::operator<<(this,local_48);
      std::__cxx11::string::substr((ulong)&local_70,(ulong)fmt);
      sprintf<int,char_const*>(oss,&local_70,local_44,local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._M_dataplus._M_p._1_7_,(char)local_70._M_dataplus._M_p) !=
          &local_70.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_70._M_dataplus._M_p._1_7_,(char)local_70._M_dataplus._M_p),
                        local_70.field_2._M_allocated_capacity + 1);
      }
      if (bVar15) {
        return;
      }
LAB_0011937a:
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar8,"extra arguments provided to sprintf");
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::substr((ulong)&local_70,(ulong)fmt);
    __nptr = (char *)CONCAT71(local_70._M_dataplus._M_p._1_7_,(char)local_70._M_dataplus._M_p);
    piVar9 = __errno_location();
    iVar3 = *piVar9;
    *piVar9 = 0;
    lVar10 = strtol(__nptr,&local_50,10);
    if (local_50 != __nptr) {
      if ((lVar10 - 0x80000000U < 0xffffffff00000000) || (*piVar9 == 0x22)) goto LAB_0011973a;
      if (*piVar9 == 0) {
        *piVar9 = iVar3;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_70._M_dataplus._M_p._1_7_,(char)local_70._M_dataplus._M_p) !=
          &local_70.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_70._M_dataplus._M_p._1_7_,(char)local_70._M_dataplus._M_p),
                        local_70.field_2._M_allocated_capacity + 1);
      }
      *(long *)(oss + *(long *)(*(long *)(oss + 0x10) + -0x18) + 0x18) = (long)(int)lVar10;
      pcVar13 = local_50 + (long)(pcVar13 + (1 - (long)__nptr));
      goto LAB_00119665;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_0011973a:
  auVar16 = std::__throw_out_of_range("stoi");
  if (auVar16._8_4_ != 1) {
    _Unwind_Resume(auVar16._0_8_);
  }
  __cxa_begin_catch(auVar16._0_8_);
  prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar8,"Expected precision value in sprintf");
  __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
sprintf(stringstream& oss, const string& fmt, T value, Args ... args)
{
    for (size_t pos = 0; pos < fmt.size(); pos++) {
        if (fmt[pos] == '%' && fmt[++pos] != '%') {
            bool alternateForm = false;
            // Find the format character
            size_t fpos = fmt.find_first_of("diouXxfFeEgGaAcsb", pos);
            for (; pos < fpos; pos++) {
                switch (fmt[pos]) {
                  case '#':
                    alternateForm = true;
                    continue;
                  case '-':
                    oss << left;
                    continue;
                  case '+':
                    oss << showpos;
                    continue;
                  case ' ':
                    continue;
                  case '0':
                    if (!(oss.flags() & oss.left))
                        oss << setfill('0');
                    continue;
                  default:
                    break;
                }
                break;
            }
            try {
                size_t afterpos;
                int width = stoi(fmt.substr(pos, fpos - pos), &afterpos);
                oss << setw(width);
                pos += afterpos;
            } catch (invalid_argument& e) {
                (void)e;
            }
            int precision = 0;
            if (fmt[pos] == '.') try {
                size_t afterpos;
                ++pos;
                precision = stoi(fmt.substr(pos, fpos - pos), &afterpos);
                if (!std::is_same<T, const char*>::value) {
                     oss << setprecision(precision);
                     precision = 0;
                }
                pos += afterpos;
            } catch (invalid_argument& e) {
                throw std::runtime_error("Expected precision value in sprintf");
                (void)e;
            }
            if (fmt[pos] == 'x' || fmt[pos] == 'X') {
                oss << hex;
                if (alternateForm) oss << showbase;
            }
            // Having another function call sucks. See streamout for the reason.
            streamout(oss, value, precision);
            return sprintf(oss, fmt.substr(++pos), args...);
        }
        oss << fmt[pos];
    }
    throw std::runtime_error("extra arguments provided to sprintf");
}